

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Vec_Int_t * Gia_ManCollectOneSide(Gia_Man_t *p,int iSide)

{
  int nCap;
  Vec_Int_t *vNodes;
  Gia_Obj_t *pGVar1;
  uint v;
  
  nCap = Gia_ManAndNum(p);
  vNodes = Vec_IntAlloc(nCap);
  Gia_ManIncrementTravId(p);
  v = 0;
  while( true ) {
    if (p->vCos->nSize - p->nRegs <= (int)v) {
      return vNodes;
    }
    pGVar1 = Gia_ManCo(p,v);
    if (pGVar1 == (Gia_Obj_t *)0x0) break;
    if ((v & 1) == iSide) {
      Gia_ManCollectOneSide_rec
                (p,pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff),vNodes);
    }
    v = v + 1;
  }
  return vNodes;
}

Assistant:

Vec_Int_t * Gia_ManCollectOneSide( Gia_Man_t * p, int iSide )
{
    Gia_Obj_t * pObj; int i;
    Vec_Int_t * vNodes = Vec_IntAlloc( Gia_ManAndNum(p) );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachPo( p, pObj, i )
        if ( (i & 1) == iSide )
            Gia_ManCollectOneSide_rec( p, Gia_ObjFanin0(pObj), vNodes );
    return vNodes;
}